

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_pushstring(lua_State *L,char *str)

{
  TValue *pTVar1;
  size_t lenx;
  GCstr *pGVar2;
  GCstr *s;
  char *str_local;
  lua_State *L_local;
  
  if (str == (char *)0x0) {
    L->top->u64 = 0xffffffffffffffff;
  }
  else {
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
    lenx = strlen(str);
    pGVar2 = lj_str_new(L,str,lenx);
    L->top->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_pushstring(lua_State *L, const char *str)
{
  if (str == NULL) {
    setnilV(L->top);
  } else {
    GCstr *s;
    lj_gc_check(L);
    s = lj_str_newz(L, str);
    setstrV(L, L->top, s);
  }
  incr_top(L);
}